

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

cmFileListGeneratorBase * __thiscall
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase *this,cmFileListGeneratorBase *next)

{
  auto_ptr<cmFileListGeneratorBase> aVar1;
  auto_ptr<cmFileListGeneratorBase> aVar2;
  auto_ptr<cmFileListGeneratorBase> local_20;
  
  (*next->_vptr_cmFileListGeneratorBase[3])(&local_20);
  aVar1.x_ = local_20.x_;
  local_20.x_ = (cmFileListGeneratorBase *)0x0;
  aVar2.x_ = (this->Next).x_;
  if (aVar2.x_ != aVar1.x_) {
    if (aVar2.x_ == (cmFileListGeneratorBase *)0x0) {
      (this->Next).x_ = aVar1.x_;
      aVar2.x_ = aVar1.x_;
    }
    else {
      (*(aVar2.x_)->_vptr_cmFileListGeneratorBase[1])();
      (this->Next).x_ = aVar1.x_;
      aVar2.x_ = aVar1.x_;
      if (local_20.x_ != (cmFileListGeneratorBase *)0x0) {
        (*(local_20.x_)->_vptr_cmFileListGeneratorBase[1])();
        aVar2.x_ = (this->Next).x_;
      }
    }
  }
  return aVar2.x_;
}

Assistant:

cmFileListGeneratorBase*
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase const& next)
{
  this->Next = next.Clone();
  return this->Next.get();
}